

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::SkipCurrentNode_abi_cxx11_(OgreXmlSerializer *this)

{
  __type _Var1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  OgreXmlSerializer *local_18;
  OgreXmlSerializer *this_local;
  
  local_18 = this;
  do {
    do {
      uVar2 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&this->m_currentNodeName,"");
        return &this->m_currentNodeName;
      }
      iVar3 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,(char *)CONCAT44(extraout_var,iVar3),&local_39);
    _Var1 = std::operator==(&local_38,&this->m_currentNodeName);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  } while (!_Var1);
  psVar4 = NextNode_abi_cxx11_(this);
  return psVar4;
}

Assistant:

std::string &OgreXmlSerializer::SkipCurrentNode()
{
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG("Skipping node <" + m_currentNodeName + ">");
#endif

    for(;;) {
        if (!m_reader->read()) {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
        if ( m_reader->getNodeType() != irr::io::EXN_ELEMENT_END ) {
            continue;
        } else if ( std::string( m_reader->getNodeName() ) == m_currentNodeName ) {
            break;
        }
    }

    return NextNode();
}